

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_decals.cpp
# Opt level: O2

void __thiscall ON_Decal::CImpl::SetIsVisible(CImpl *this,bool b)

{
  int iVar1;
  undefined7 in_register_00000031;
  ON_XMLVariant OStack_108;
  
  iVar1 = (int)CONCAT71(in_register_00000031,b);
  if ((this->_cache).visible != iVar1) {
    (this->_cache).visible = iVar1;
    ::ON_XMLVariant::ON_XMLVariant(&OStack_108,b);
    SetParameter(this,L"is-visible",&OStack_108);
    ::ON_XMLVariant::~ON_XMLVariant(&OStack_108);
  }
  return;
}

Assistant:

void ON_Decal::CImpl::SetIsVisible(bool b)
{
  const int i = b ? 1 : 0;
  if (_cache.visible != i)
  {
    _cache.visible = i;
    SetParameter(ON_RDK_DECAL_IS_VISIBLE, b);
  }
}